

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O2

void Abc_NtkPrintPoEquivs(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  
  iVar8 = pNtk->vObjs->nSize;
  p = Vec_IntAlloc(iVar8);
  p->nSize = iVar8;
  if (p->pArray != (int *)0x0) {
    memset(p->pArray,0xff,(long)iVar8 << 2);
  }
  iVar8 = 0;
  do {
    if (pNtk->vPos->nSize <= iVar8) {
      Vec_IntFree(p);
      return;
    }
    pObj = Abc_NtkPo(pNtk,iVar8);
    pAVar5 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray];
    if (pNtk->ntkType == ABC_NTK_STRASH) {
      pAVar3 = Abc_AigConst1(pNtk);
      if (pAVar5 != pAVar3) {
        if (pNtk->ntkType != ABC_NTK_STRASH) goto LAB_002aaf8d;
        goto LAB_002aafb9;
      }
      pcVar4 = Abc_ObjName(pObj);
      uVar7 = (ulong)((*(uint *)&pObj->field_0x14 >> 10 & 1) == 0);
LAB_002ab04a:
      printf("%s = Const%d\n",pcVar4,uVar7);
    }
    else {
LAB_002aaf8d:
      iVar1 = Abc_NodeIsConst(pAVar5);
      if (iVar1 != 0) {
        pcVar4 = Abc_ObjName(pObj);
        uVar2 = Abc_NodeIsConst1(pAVar5);
        uVar7 = (ulong)uVar2;
        goto LAB_002ab04a;
      }
LAB_002aafb9:
      iVar1 = Vec_IntEntry(p,pAVar5->Id);
      if (iVar1 == -1) {
        Vec_IntWriteEntry(p,pAVar5->Id,iVar8);
      }
      else {
        pAVar5 = Abc_NtkCo(pNtk,iVar1);
        pcVar4 = Abc_ObjName(pObj);
        pcVar9 = "!";
        if (((*(uint *)&pObj->field_0x14 ^ *(uint *)&pAVar5->field_0x14) >> 10 & 1) == 0) {
          pcVar9 = "";
        }
        pcVar6 = Abc_ObjName(pAVar5);
        printf("%s = %s%s\n",pcVar4,pcVar9,pcVar6);
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Abc_NtkPrintPoEquivs( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pDriver, * pRepr;  int i, iRepr;
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        pDriver = Abc_ObjFanin0(pObj);
        if ( Abc_NtkIsStrash(pNtk) && pDriver == Abc_AigConst1(pNtk) )
        {
            printf( "%s = Const%d\n", Abc_ObjName(pObj), !Abc_ObjFaninC0(pObj) );
            continue;
        }
        else if ( !Abc_NtkIsStrash(pNtk) && Abc_NodeIsConst(pDriver) )
        {
            printf( "%s = Const%d\n", Abc_ObjName(pObj), Abc_NodeIsConst1(pDriver) );
            continue;
        }
        iRepr = Vec_IntEntry( vMap, Abc_ObjId(pDriver) );
        if ( iRepr == -1 )
        {
            Vec_IntWriteEntry( vMap, Abc_ObjId(pDriver), i );
            continue;
        }
        pRepr = Abc_NtkCo(pNtk, iRepr);
        printf( "%s = %s%s\n", Abc_ObjName(pObj), Abc_ObjFaninC0(pRepr) == Abc_ObjFaninC0(pObj) ? "" : "!", Abc_ObjName(pRepr) );
    }
    Vec_IntFree( vMap );
}